

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O1

crn_format crnd::crnd_get_fundamental_dxt_format(crn_format fmt)

{
  crn_format cVar1;
  
  cVar1 = cCRNFmtDXT5;
  if (3 < (ulong)(fmt + ~cCRNFmtDXT5)) {
    cVar1 = fmt;
  }
  return cVar1;
}

Assistant:

crn_format crnd_get_fundamental_dxt_format(crn_format fmt)
    {
        switch (fmt)
        {
            case cCRNFmtDXT5_CCxY:
            case cCRNFmtDXT5_xGxR:
            case cCRNFmtDXT5_xGBR:
            case cCRNFmtDXT5_AGBR:
                return cCRNFmtDXT5;
            default:
                break;
        }
        return fmt;
    }